

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void ws_dialer_dial(void *arg,nni_aio *aio)

{
  nni_mtx *mtx;
  _Bool _Var1;
  nng_err result;
  nni_ws *local_30;
  nni_ws *ws;
  
  nni_aio_reset(aio);
  result = ws_init(&local_30);
  if (result != NNG_OK) {
    nni_aio_finish_error(aio,result);
    return;
  }
  mtx = (nni_mtx *)((long)arg + 0x58);
  nni_mtx_lock(mtx);
  if (*(char *)((long)arg + 0xe0) == '\x01') {
    nni_mtx_unlock(mtx);
    nni_aio_finish_error(aio,NNG_ECLOSED);
  }
  else {
    _Var1 = nni_aio_start(aio,ws_dial_cancel,local_30);
    if (_Var1) {
      local_30->dialer = (nni_ws_dialer *)arg;
      local_30->useraio = aio;
      local_30->server = false;
      local_30->maxframe = *(size_t *)((long)arg + 0x100);
      local_30->isstream = *(_Bool *)((long)arg + 0xe1);
      local_30->recv_text = *(_Bool *)((long)arg + 0xe3);
      local_30->send_text = *(_Bool *)((long)arg + 0xe2);
      nni_list_append((nni_list *)((long)arg + 200),local_30);
      nni_http_client_connect(*(nni_http_client **)((long)arg + 0x50),&local_30->connaio);
      nni_mtx_unlock(mtx);
      return;
    }
    nni_mtx_unlock(mtx);
  }
  ws_reap(local_30);
  return;
}

Assistant:

static void
ws_dialer_dial(void *arg, nni_aio *aio)
{
	nni_ws_dialer *d = arg;
	nni_ws        *ws;
	int            rv;

	nni_aio_reset(aio);
	if ((rv = ws_init(&ws)) != 0) {
		nni_aio_finish_error(aio, rv);
		return;
	}
	nni_mtx_lock(&d->mtx);
	if (d->closed) {
		nni_mtx_unlock(&d->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		ws_reap(ws);
		return;
	}
	if (!nni_aio_start(aio, ws_dial_cancel, ws)) {
		nni_mtx_unlock(&d->mtx);
		ws_reap(ws);
		return;
	}
	ws->dialer    = d;
	ws->useraio   = aio;
	ws->server    = false;
	ws->maxframe  = d->maxframe;
	ws->isstream  = d->isstream;
	ws->recv_text = d->recv_text;
	ws->send_text = d->send_text;
	nni_list_append(&d->wspend, ws);
	nni_http_client_connect(d->client, &ws->connaio);
	nni_mtx_unlock(&d->mtx);
}